

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::load(CDT *this,string *filepath)

{
  ifstream file;
  long local_210 [4];
  byte abStack_1f0 [488];
  
  std::ifstream::ifstream(local_210,(string *)filepath,_S_in);
  if ((abStack_1f0[*(long *)(local_210[0] + -0x18)] & 5) == 0) {
    std::ifstream::close();
    std::ifstream::~ifstream(local_210);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [loading model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::load(const std::string& filepath){
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}